

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_msb.hpp
# Opt level: O2

ans_msb_decode * ans_msb_decode::load(ans_msb_decode *__return_storage_ptr__,uint8_t *in_u8)

{
  uint uVar1;
  pointer puVar2;
  pointer pdVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  uint32_t uVar6;
  pointer puVar7;
  uint64_t uVar8;
  int iVar9;
  uint x;
  long lVar10;
  ulong uVar11;
  uint32_t except_bytes;
  int iVar12;
  undefined1 auVar13 [64];
  undefined1 in_XMM1 [16];
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  undefined1 extraout_var [56];
  
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->table).super__Vector_base<dec_entry_msb,_std::allocator<dec_entry_msb>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->table).super__Vector_base<dec_entry_msb,_std::allocator<dec_entry_msb>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->table).super__Vector_base<dec_entry_msb,_std::allocator<dec_entry_msb>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ans_load_interp((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,in_u8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&__return_storage_ptr__->nfreqs,&local_48);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  iVar9 = 0;
  for (puVar7 = (__return_storage_ptr__->nfreqs).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar7 != (__return_storage_ptr__->nfreqs).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish; puVar7 = puVar7 + 1) {
    iVar9 = iVar9 + *puVar7;
  }
  uVar8 = (uint64_t)iVar9;
  auVar4 = vcvtusi2sd_avx512f(in_XMM1,uVar8);
  __return_storage_ptr__->frame_size = uVar8;
  __return_storage_ptr__->frame_mask = uVar8 - 1;
  auVar13._0_8_ = log2(auVar4._0_8_);
  auVar13._8_56_ = extraout_var;
  uVar8 = vcvttsd2usi_avx512f(auVar13._0_16_);
  __return_storage_ptr__->frame_log2 = uVar8;
  std::vector<dec_entry_msb,_std::allocator<dec_entry_msb>_>::resize
            (&__return_storage_ptr__->table,__return_storage_ptr__->frame_size);
  puVar7 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar9 = 0;
  for (lVar10 = 0; lVar10 != (long)puVar2 - (long)puVar7 >> 2; lVar10 = lVar10 + 1) {
    x = (uint)lVar10;
    uVar1 = puVar7[lVar10];
    iVar12 = (0x300 < x | 0xfffffffe) << 0x1e;
    if (x < 0x201) {
      iVar12 = 0x40000000;
    }
    if (x < 0x101) {
      iVar12 = 0;
    }
    pdVar3 = (__return_storage_ptr__->table).
             super__Vector_base<dec_entry_msb,_std::allocator<dec_entry_msb>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar11 = 0; uVar1 != uVar11; uVar11 = uVar11 + 1) {
      uVar5 = iVar9 + (uint32_t)uVar11;
      pdVar3[uVar5].freq = uVar1;
      uVar6 = ans_msb_undo_mapping(x);
      pdVar3[uVar5].mapped_num = uVar6 + iVar12;
      pdVar3[uVar5].offset = (uint32_t)uVar11;
    }
    iVar9 = iVar9 + puVar7[lVar10];
  }
  __return_storage_ptr__->lower_bound = __return_storage_ptr__->frame_size << 4;
  return __return_storage_ptr__;
}

Assistant:

static ans_msb_decode load(const uint8_t* in_u8)
    {
        ans_msb_decode model;
        model.nfreqs = ans_load_interp(in_u8);
        model.frame_size = std::accumulate(
            std::begin(model.nfreqs), std::end(model.nfreqs), 0);
        model.frame_mask = model.frame_size - 1;
        model.frame_log2 = log2(model.frame_size);
        model.table.resize(model.frame_size);
        auto max_sym = model.nfreqs.size() - 1;
        uint64_t tmp = constants::K * constants::RADIX;
        uint32_t cur_base = 0;
        for (size_t sym = 0; sym <= max_sym; sym++) {
            auto cur_freq = model.nfreqs[sym];
            for (uint32_t k = 0; k < cur_freq; k++) {
                uint32_t except_bytes = ans_msb_exception_bytes(sym);
                model.table[cur_base + k].freq = cur_freq;
                model.table[cur_base + k].mapped_num
                    = ans_msb_undo_mapping(sym) + (except_bytes << 30);
                model.table[cur_base + k].offset = k;
            }
            cur_base += model.nfreqs[sym];
        }
        model.lower_bound = constants::K * model.frame_size;
        return model;
    }